

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O0

int mbedtls_mpi_core_read_be(mbedtls_mpi_uint *X,size_t X_limbs,uchar *input,size_t input_length)

{
  mbedtls_mpi_uint *A;
  ulong in_RCX;
  void *in_RDX;
  mbedtls_mpi_uint *in_RSI;
  void *in_RDI;
  uchar *Xp;
  size_t overhead;
  size_t limbs;
  size_t in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  A = (mbedtls_mpi_uint *)((in_RCX >> 3) + (ulong)((in_RCX & 7) != 0));
  if (in_RSI < A) {
    local_4 = -8;
  }
  else if (in_RSI == (mbedtls_mpi_uint *)0x0) {
    local_4 = 0;
  }
  else {
    memset(in_RDI,0,(long)in_RSI << 3);
    if (in_RCX != 0) {
      in_stack_ffffffffffffffc8 = (long)in_RSI * 8 - in_RCX;
      memcpy((void *)((long)in_RDI + in_stack_ffffffffffffffc8),in_RDX,in_RCX);
    }
    mbedtls_mpi_core_bigendian_to_host(A,in_stack_ffffffffffffffc8);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mbedtls_mpi_core_read_be(mbedtls_mpi_uint *X,
                             size_t X_limbs,
                             const unsigned char *input,
                             size_t input_length)
{
    const size_t limbs = CHARS_TO_LIMBS(input_length);

    if (X_limbs < limbs) {
        return MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL;
    }

    /* If X_limbs is 0, input_length must also be 0 (from previous test).
     * Nothing to do. */
    if (X_limbs == 0) {
        return 0;
    }

    memset(X, 0, X_limbs * ciL);

    /* memcpy() with (NULL, 0) is undefined behaviour */
    if (input_length != 0) {
        size_t overhead = (X_limbs * ciL) - input_length;
        unsigned char *Xp = (unsigned char *) X;
        memcpy(Xp + overhead, input, input_length);
    }

    mbedtls_mpi_core_bigendian_to_host(X, X_limbs);

    return 0;
}